

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__build_huffman(stbi__huffman *h,int *count)

{
  ushort uVar1;
  ulong uVar2;
  undefined8 *puVar3;
  byte bVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  char *pcVar10;
  
  lVar6 = 0;
  pcVar10 = "bad size list";
  iVar7 = 0;
  do {
    if (0 < count[lVar6]) {
      iVar8 = 0x100;
      if (0x100 < iVar7) {
        iVar8 = iVar7;
      }
      lVar9 = 0;
      do {
        h->size[lVar9 + iVar7] = (char)lVar6 + '\x01';
        if ((iVar7 - iVar8) + (int)lVar9 == 0) goto LAB_00138fd1;
        lVar9 = lVar9 + 1;
      } while ((int)lVar9 < count[lVar6]);
      iVar7 = iVar7 + (int)lVar9;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x10);
  h->size[iVar7] = '\0';
  iVar7 = 0;
  uVar2 = 1;
  pcVar10 = "bad code lengths";
  uVar5 = 0;
  do {
    h->delta[uVar2] = uVar5 - iVar7;
    lVar6 = (long)(int)uVar5;
    if (uVar2 == h->size[lVar6]) {
      if (uVar2 == h->size[lVar6]) {
        do {
          h->code[lVar6] = (stbi__uint16)iVar7;
          iVar7 = iVar7 + 1;
          lVar9 = lVar6 + 1;
          lVar6 = lVar6 + 1;
        } while (uVar2 == h->size[lVar9]);
        uVar5 = (uint)lVar6;
      }
      if (iVar7 - 1U >> ((byte)uVar2 & 0x1f) != 0) {
LAB_00138fd1:
        puVar3 = (undefined8 *)__tls_get_addr(&PTR_00164d50);
        *puVar3 = pcVar10;
        return 0;
      }
    }
    h->maxcode[uVar2] = iVar7 << (0x10 - (byte)uVar2 & 0x1f);
    iVar7 = iVar7 * 2;
    uVar2 = uVar2 + 1;
    if (uVar2 == 0x11) {
      h->maxcode[0x11] = 0xffffffff;
      memset(h,0xff,0x200);
      if (0 < (int)uVar5) {
        uVar2 = 0;
        do {
          if (h->size[uVar2] < 10) {
            uVar1 = h->code[uVar2];
            bVar4 = 9 - h->size[uVar2];
            lVar6 = 0;
            do {
              h->fast[lVar6 + ((ulong)uVar1 << (bVar4 & 0x3f))] = (stbi_uc)uVar2;
              lVar6 = lVar6 + 1;
            } while ((uint)lVar6 >> (bVar4 & 0x1f) == 0);
          }
          uVar2 = uVar2 + 1;
        } while (uVar2 != uVar5);
      }
      return 1;
    }
  } while( true );
}

Assistant:

static int stbi__build_huffman(stbi__huffman *h, int *count)
{
   int i,j,k=0;
   unsigned int code;
   // build size list for each symbol (from JPEG spec)
   for (i=0; i < 16; ++i) {
      for (j=0; j < count[i]; ++j) {
         h->size[k++] = (stbi_uc) (i+1);
         if(k >= 257) return stbi__err("bad size list","Corrupt JPEG");
      }
   }
   h->size[k] = 0;

   // compute actual symbols (from jpeg spec)
   code = 0;
   k = 0;
   for(j=1; j <= 16; ++j) {
      // compute delta to add to code to compute symbol id
      h->delta[j] = k - code;
      if (h->size[k] == j) {
         while (h->size[k] == j)
            h->code[k++] = (stbi__uint16) (code++);
         if (code-1 >= (1u << j)) return stbi__err("bad code lengths","Corrupt JPEG");
      }
      // compute largest code + 1 for this size, preshifted as needed later
      h->maxcode[j] = code << (16-j);
      code <<= 1;
   }
   h->maxcode[j] = 0xffffffff;

   // build non-spec acceleration table; 255 is flag for not-accelerated
   memset(h->fast, 255, 1 << FAST_BITS);
   for (i=0; i < k; ++i) {
      int s = h->size[i];
      if (s <= FAST_BITS) {
         int c = h->code[i] << (FAST_BITS-s);
         int m = 1 << (FAST_BITS-s);
         for (j=0; j < m; ++j) {
            h->fast[c+j] = (stbi_uc) i;
         }
      }
   }
   return 1;
}